

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::KotlinKMPGenerator
          (KotlinKMPGenerator *this,Parser *parser,string *path,string *file_name)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  Config local_350;
  Config local_200;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  KotlinKMPGenerator *this_local;
  
  local_28 = file_name;
  file_name_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,".",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"kt",&local_a9);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_48,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_004fa0c0;
  anon_unknown_0::KotlinDefaultConfig();
  WithFlagOptions(&local_200,&local_350,(IDLOptions *)&path_local[0x1f]._M_string_length,
                  file_name_local);
  (anonymous_namespace)::KotlinKeywords_abi_cxx11_();
  IdlNamer::IdlNamer(&this->namer_,&local_200,&local_380);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_380);
  Namer::Config::~Config(&local_200);
  Namer::Config::~Config(&local_350);
  return;
}

Assistant:

KotlinKMPGenerator(const Parser &parser, const std::string &path,
                     const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", ".", "kt"),
        namer_(WithFlagOptions(KotlinDefaultConfig(), parser.opts, path),
               KotlinKeywords()) {}